

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

bool __thiscall
Ptex::v2_2::PtexReaderCache::findFile
          (PtexReaderCache *this,char **filename,string *buffer,String *error)

{
  char *pcVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string errstr;
  stat statbuf;
  long *local_e0 [2];
  long local_d0 [2];
  stat local_c0;
  
  bVar7 = true;
  if ((**filename != '/') &&
     ((this->_searchdirs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->_searchdirs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::reserve((ulong)buffer);
    lVar4 = (long)(this->_searchdirs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_searchdirs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar7 = lVar4 != 0;
    if (bVar7) {
      uVar5 = lVar4 >> 5;
      uVar6 = 1;
      do {
        std::__cxx11::string::_M_assign((string *)buffer);
        std::__cxx11::string::append((char *)buffer);
        std::__cxx11::string::append((char *)buffer);
        iVar3 = stat((buffer->_M_dataplus)._M_p,&local_c0);
        if (iVar3 == 0) {
          *filename = (buffer->_M_dataplus)._M_p;
          return bVar7;
        }
        bVar7 = uVar6 < uVar5;
        lVar4 = (-(ulong)(uVar5 == 0) - uVar5) + uVar6;
        uVar6 = uVar6 + 1;
      } while (lVar4 != 0);
    }
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"Can\'t find ptex file: ","")
    ;
    std::__cxx11::string::append((char *)local_e0);
    plVar2 = local_e0[0];
    pcVar1 = (char *)error->_M_string_length;
    strlen((char *)local_e0[0]);
    std::__cxx11::string::_M_replace((ulong)error,0,pcVar1,(ulong)plVar2);
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
  }
  return bVar7;
}

Assistant:

bool PtexReaderCache::findFile(const char*& filename, std::string& buffer, Ptex::String& error)
{
    bool isAbsolute = (filename[0] == '/'
#ifdef WINDOWS
                       || filename[0] == '\\'
                       || (isalpha(filename[0]) && filename[1] == ':')
#endif
    );
    if (isAbsolute || _searchdirs.empty()) return true; // no need to search

    // file is relative, search in searchpath
    buffer.reserve(256); // minimize reallocs (will grow automatically)
    struct stat statbuf;
    for (size_t i = 0, size = _searchdirs.size(); i < size; i++) {
        buffer = _searchdirs[i];
        buffer += "/";
        buffer += filename;
        if (stat(buffer.c_str(), &statbuf) == 0) {
            filename = buffer.c_str();
            return true;
        }
    }
    // not found
    std::string errstr = "Can't find ptex file: ";
    errstr += filename;
    error = errstr.c_str();
    return false;
}